

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hrgls_DataBlob_impl.hpp
# Opt level: O2

void __thiscall hrgls::datablob::DataBlob::DataBlob(DataBlob *this,hrgls_DataBlob blob)

{
  hrgls_Status hVar1;
  DataBlob_private *returnBlob;
  
  this->m_private = (DataBlob_private *)0x0;
  returnBlob = (DataBlob_private *)operator_new(0x10);
  returnBlob->blob = (hrgls_DataBlob)0x0;
  returnBlob->status = 0;
  this->m_private = returnBlob;
  if (blob == (hrgls_DataBlob)0x0) {
    returnBlob->status = 0x3e9;
  }
  else {
    hVar1 = hrgls_DataBlobCopy((hrgls_DataBlob *)returnBlob,blob);
    this->m_private->status = hVar1;
  }
  return;
}

Assistant:

DataBlob::DataBlob(hrgls_DataBlob blob)
    {
      m_private = new DataBlob_private;
      if (!blob) {
        m_private->status = hrgls_STATUS_BAD_PARAMETER;
        return;
      }
      m_private->status = hrgls_DataBlobCopy(&m_private->blob, blob);
    }